

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O3

char * serialize_get(char *r,SBufExt *sbx,TValue *o)

{
  TValue *pTVar1;
  long lVar2;
  byte bVar3;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar4;
  uint uVar5;
  GCstr *pGVar6;
  void *pvVar7;
  GCtab *t;
  TValue *pTVar8;
  short sVar9;
  undefined8 in_RCX;
  uint64_t uVar10;
  uint32_t uVar11;
  ErrMsg em;
  uint uVar12;
  ulong uVar13;
  TValue *cdo;
  uint64_t *w;
  uint64_t *r_00;
  byte *r_01;
  uint64_t *puVar14;
  uint32_t tp;
  uint32_t nhash;
  uint32_t narray;
  uint32_t idx;
  uint local_58;
  undefined4 local_54;
  uint32_t local_50;
  uint32_t local_4c;
  cTValue local_48;
  ulong local_40;
  MRef *local_38;
  
  w = (uint64_t *)sbx->w;
  if (r < w) {
    uVar13 = (ulong)(byte)*r;
    r_00 = (uint64_t *)(r + 1);
    local_58 = (uint)(byte)*r;
    if (0xdf < local_58) {
      r_00 = (uint64_t *)serialize_ru124_((char *)r_00,(char *)w,&local_58);
      if (r_00 == (uint64_t *)0x0) goto LAB_0011b153;
      uVar13 = (ulong)local_58;
    }
    uVar12 = (uint)uVar13;
    if (0x1f < uVar12) {
      uVar12 = uVar12 - 0x20;
      if (uVar12 <= (uint)((int)w - (int)r_00)) {
        pGVar6 = lj_str_new((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),(char *)r_00,
                            (ulong)uVar12);
        o->u64 = (ulong)pGVar6 | 0xfffd800000000000;
        return (char *)(byte *)((long)r_00 + (ulong)uVar12);
      }
      goto LAB_0011b153;
    }
    if (uVar12 == 7) {
      if (r_00 + 1 <= w) {
        uVar10 = 0xfff8000000000000;
        if ((ushort)(*r_00 >> 0x30) < 0xfff9) {
          uVar10 = *r_00;
        }
        o->u64 = uVar10;
        return (char *)(r_00 + 1);
      }
      goto LAB_0011b153;
    }
    if (uVar12 == 6) {
      if ((uint64_t *)((long)r_00 + 4U) <= w) {
        o->n = (double)(int)(uint)*r_00;
        return (char *)(uint64_t *)((long)r_00 + 4U);
      }
      goto LAB_0011b153;
    }
    if (uVar12 < 3) {
      o->u64 = ~(uVar13 << 0x2f);
      return (char *)r_00;
    }
    if (uVar12 != 0xf) {
      if (uVar12 - 8 < 7) {
        local_4c = 0;
        local_50 = 0;
        if (sbx->depth < 1) {
          lj_err_caller((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),LJ_ERR_BUFFER_DEPTH);
        }
        sbx->depth = sbx->depth + -1;
        if (uVar12 == 0xe) {
          if (r_00 < w) {
            bVar3 = (byte)*r_00;
            local_48.field_4.i = (int32_t)bVar3;
            puVar14 = (uint64_t *)((long)r_00 + 1);
            if ((bVar3 < 0xe0) ||
               (local_48.u32.lo = (uint)bVar3,
               puVar14 = (uint64_t *)
                         serialize_ru124_((char *)puVar14,(char *)w,(uint32_t *)&local_48.u64),
               puVar14 != (uint64_t *)0x0)) {
              local_48.field_4.i = local_48.field_4.i + 1;
              uVar10 = (sbx->dict_mt).gcptr64;
              if ((uVar10 != 0) && (local_48.u32.lo < *(uint *)(uVar10 + 0x30))) {
                local_40 = *(ulong *)(*(long *)(uVar10 + 0x10) + (ulong)local_48.u32.lo * 8);
                in_RCX = 0;
                if ((local_40 & 0xffff800000000000) == 0xfffa000000000000) {
                  if (puVar14 < w) {
                    uVar13 = (ulong)(byte)*puVar14;
                    r_00 = (uint64_t *)((long)puVar14 + 1);
                    local_58 = (uint)(byte)*puVar14;
                    if (0xdf < local_58) {
                      r_00 = (uint64_t *)serialize_ru124_((char *)r_00,(char *)w,&local_58);
                      if (r_00 == (uint64_t *)0x0) goto LAB_0011b153;
                      uVar13 = (ulong)local_58;
                    }
                    if (5 < (int)uVar13 - 8U) goto LAB_0011b181;
                    local_40 = local_40 & 0x7fffffffffff;
                    goto LAB_0011af0a;
                  }
                  goto LAB_0011b153;
                }
              }
              goto LAB_0011b15b;
            }
          }
        }
        else {
          local_40 = 0;
LAB_0011af0a:
          if ((uint)uVar13 < 10) {
LAB_0011af2f:
            if ((uVar13 & 1) == 0) {
              uVar10 = (sbx->L).ptr64;
              local_54 = (undefined4)CONCAT71((int7)((ulong)&sbx->L >> 8),1);
              w = (uint64_t *)(ulong)local_4c;
              uVar11 = 0;
LAB_0011afec:
              local_38 = &sbx->L;
              t = lj_tab_new((lua_State *)(uVar10 & 0xfffffffffffffff8),(uint32_t)w,uVar11);
              (t->metatable).gcptr64 = local_40;
              o->u64 = (ulong)t | 0xfffa000000000000;
              if (((uint32_t)w != 0) &&
                 (puVar14 = (uint64_t *)(ulong)(0xb < (uint)uVar13), puVar14 < w)) {
                uVar10 = (t->array).ptr64;
                pTVar8 = (TValue *)(uVar10 + (long)puVar14 * 8);
                do {
                  pTVar1 = pTVar8 + 1;
                  r_00 = (uint64_t *)serialize_get((char *)r_00,sbx,pTVar8);
                  pTVar8 = pTVar1;
                } while (pTVar1 < (TValue *)(uVar10 + (long)w * 8));
              }
              if ((char)local_54 == '\0') {
                o = &local_48;
                do {
                  r_01 = (byte *)serialize_get((char *)r_00,sbx,o);
                  pTVar8 = lj_tab_set((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),t,o);
                  if (pTVar8->u64 != 0xffffffffffffffff) {
                    serialize_get_cold_1();
                    goto LAB_0011b0af;
                  }
                  r_00 = (uint64_t *)serialize_get((char *)r_01,sbx,pTVar8);
                  local_50 = local_50 - 1;
                } while (local_50 != 0);
              }
              sbx->depth = sbx->depth + 1;
              return (char *)r_00;
            }
            if (r_00 < w) {
              uVar10 = *r_00;
              r_00 = (uint64_t *)((long)r_00 + 1);
              local_50 = (uint32_t)(byte)uVar10;
              if ((local_50 < 0xe0) ||
                 (r_00 = (uint64_t *)serialize_ru124_((char *)r_00,(char *)w,&local_50),
                 r_00 != (uint64_t *)0x0)) {
                uVar10 = (sbx->L).ptr64;
                w = (uint64_t *)(ulong)local_4c;
                uVar11 = local_50;
                if (local_50 == 0) {
                  local_54 = (undefined4)CONCAT71((int7)((ulong)&sbx->L >> 8),1);
                }
                else {
                  uVar12 = local_50 - 1;
                  if (uVar12 == 0) {
                    local_54 = 0;
                  }
                  else {
                    local_54 = (undefined4)CONCAT71((int7)((ulong)in_RCX >> 8),local_50 == 0);
                    uVar5 = 0x1f;
                    if (uVar12 != 0) {
                      for (; uVar12 >> uVar5 == 0; uVar5 = uVar5 - 1) {
                      }
                    }
                    uVar11 = (uVar5 ^ 0xffffffe0) + 0x21;
                  }
                }
                goto LAB_0011afec;
              }
            }
          }
          else if (r_00 < w) {
            uVar10 = *r_00;
            r_00 = (uint64_t *)((long)r_00 + 1);
            local_4c = (uint32_t)(byte)uVar10;
            if ((local_4c < 0xe0) ||
               (r_00 = (uint64_t *)serialize_ru124_((char *)r_00,(char *)w,&local_4c),
               r_00 != (uint64_t *)0x0)) goto LAB_0011af2f;
          }
        }
      }
      else if (uVar12 - 0x10 < 3) {
        if (r_00 + (ulong)(uVar12 == 0x12) + 1 <= w) {
          lVar2 = (ulong)(uVar12 == 0x12) * 8;
          local_40 = lVar2 + 8;
          pvVar7 = lj_mem_newgco((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),lVar2 + 0x18);
          *(undefined1 *)((long)pvVar7 + 9) = 10;
          sVar9 = 0xb;
          if (uVar12 != 0x10) {
            sVar9 = (ushort)(uVar12 != 0x11) * 4 + 0xc;
          }
          *(short *)((long)pvVar7 + 10) = sVar9;
          memcpy((undefined8 *)((long)pvVar7 + 0x10),r_00,local_40);
          if (uVar12 == 0x12) {
            if (0xfff8 < *(ushort *)((long)pvVar7 + 0x16)) {
              *(undefined8 *)((long)pvVar7 + 0x10) = 0xfff8000000000000;
            }
            if (0xfff8ffffffffffff < *(ulong *)((long)pvVar7 + 0x18)) {
              *(undefined8 *)((long)pvVar7 + 0x18) = 0xfff8000000000000;
            }
          }
          o->u64 = (ulong)pvVar7 | 0xfffa800000000000;
          return (char *)(r_00 + (ulong)(uVar12 == 0x12) + 1);
        }
      }
      else {
        if (5 < uVar12) {
LAB_0011b181:
          uVar13 = (sbx->L).ptr64;
          em = LJ_ERR_BUFFER_BADDEC;
          goto LAB_0011b168;
        }
        if (uVar12 == 5) {
          puVar14 = r_00 + 1;
          if (puVar14 <= w) {
            pvVar7 = (void *)*r_00;
            goto LAB_0011afb2;
          }
        }
        else {
          if (uVar12 != 4) {
            pvVar7 = (void *)0x0;
            puVar14 = r_00;
LAB_0011afb2:
            pvVar7 = lj_lightud_intern((lua_State *)((sbx->L).ptr64 & 0xfffffffffffffff8),pvVar7);
            o->u64 = (ulong)pvVar7 | 0xfffe000000000000;
            return (char *)puVar14;
          }
          puVar14 = (uint64_t *)((long)r_00 + 4);
          if (puVar14 <= w) {
            pvVar7 = (void *)(ulong)(uint)*r_00;
            goto LAB_0011afb2;
          }
        }
      }
      goto LAB_0011b153;
    }
    if (w <= r_00) goto LAB_0011b153;
    r_01 = (byte *)((long)r_00 + 1);
    local_48.field_4.i = (int32_t)(byte)*r_00;
    if (0xdf < local_48.u32.lo) {
LAB_0011b0af:
      r_01 = (byte *)serialize_ru124_((char *)r_01,(char *)w,(uint32_t *)&local_48.u64);
      if (r_01 == (byte *)0x0) goto LAB_0011b153;
    }
    uVar10 = (sbx->dict_str).gcptr64;
    if (((uVar10 != 0) && (local_48.field_4.i + 1U < *(uint *)(uVar10 + 0x30))) &&
       (aVar4 = *(anon_struct_8_2_7fa0a05d_for_TValue_4 *)
                 (*(long *)(uVar10 + 0x10) + (ulong)(local_48.field_4.i + 1U) * 8),
       aVar4.it >> 0xf == 0x1fffb)) {
      o->field_4 = aVar4;
      return (char *)r_01;
    }
  }
  else {
LAB_0011b153:
    serialize_get_cold_2();
  }
LAB_0011b15b:
  uVar13 = (sbx->L).ptr64;
  em = LJ_ERR_BUFFER_BADDICTX;
LAB_0011b168:
  lj_err_callerv((lua_State *)(uVar13 & 0xfffffffffffffff8),em);
}

Assistant:

static char *serialize_get(char *r, SBufExt *sbx, TValue *o)
{
  char *w = sbx->w;
  uint32_t tp;
  r = serialize_ru124(r, w, &tp); if (LJ_UNLIKELY(!r)) goto eob;
  if (LJ_LIKELY(tp >= SER_TAG_STR)) {
    uint32_t len = tp - SER_TAG_STR;
    if (LJ_UNLIKELY(len > (uint32_t)(w - r))) goto eob;
    setstrV(sbufL(sbx), o, lj_str_new(sbufL(sbx), r, len));
    r += len;
  } else if (tp == SER_TAG_INT) {
    if (LJ_UNLIKELY(r + 4 > w)) goto eob;
    setintV(o, (int32_t)(LJ_BE ? lj_bswap(lj_getu32(r)) : lj_getu32(r)));
    r += 4;
  } else if (tp == SER_TAG_NUM) {
    if (LJ_UNLIKELY(r + 8 > w)) goto eob;
    memcpy(o, r, 8); r += 8;
#if LJ_BE
    o->u64 = lj_bswap64(o->u64);
#endif
    if (!tvisnum(o)) setnanV(o);  /* Fix non-canonical NaNs. */
  } else if (tp <= SER_TAG_TRUE) {
    setpriV(o, ~tp);
  } else if (tp == SER_TAG_DICT_STR) {
    GCtab *dict_str;
    uint32_t idx;
    r = serialize_ru124(r, w, &idx); if (LJ_UNLIKELY(!r)) goto eob;
    idx++;
    dict_str = tabref(sbx->dict_str);
    if (dict_str && idx < dict_str->asize && tvisstr(arrayslot(dict_str, idx)))
      copyTV(sbufL(sbx), o, arrayslot(dict_str, idx));
    else
      lj_err_callerv(sbufL(sbx), LJ_ERR_BUFFER_BADDICTX, idx);
  } else if (tp >= SER_TAG_TAB && tp <= SER_TAG_DICT_MT) {
    uint32_t narray = 0, nhash = 0;
    GCtab *t, *mt = NULL;
    if (sbx->depth <= 0) lj_err_caller(sbufL(sbx), LJ_ERR_BUFFER_DEPTH);
    sbx->depth--;
    if (tp == SER_TAG_DICT_MT) {
      GCtab *dict_mt;
      uint32_t idx;
      r = serialize_ru124(r, w, &idx); if (LJ_UNLIKELY(!r)) goto eob;
      idx++;
      dict_mt = tabref(sbx->dict_mt);
      if (dict_mt && idx < dict_mt->asize && tvistab(arrayslot(dict_mt, idx)))
	mt = tabV(arrayslot(dict_mt, idx));
      else
	lj_err_callerv(sbufL(sbx), LJ_ERR_BUFFER_BADDICTX, idx);
      r = serialize_ru124(r, w, &tp); if (LJ_UNLIKELY(!r)) goto eob;
      if (!(tp >= SER_TAG_TAB && tp < SER_TAG_DICT_MT)) goto badtag;
    }
    if (tp >= SER_TAG_TAB+2) {
      r = serialize_ru124(r, w, &narray); if (LJ_UNLIKELY(!r)) goto eob;
    }
    if ((tp & 1)) {
      r = serialize_ru124(r, w, &nhash); if (LJ_UNLIKELY(!r)) goto eob;
    }
    t = lj_tab_new(sbufL(sbx), narray, hsize2hbits(nhash));
    /* NOBARRIER: The table is new (marked white). */
    setgcref(t->metatable, obj2gco(mt));
    settabV(sbufL(sbx), o, t);
    if (narray) {
      TValue *oa = tvref(t->array) + (tp >= SER_TAG_TAB+4);
      TValue *oe = tvref(t->array) + narray;
      while (oa < oe) r = serialize_get(r, sbx, oa++);
    }
    if (nhash) {
      do {
	TValue k, *v;
	r = serialize_get(r, sbx, &k);
	v = lj_tab_set(sbufL(sbx), t, &k);
	if (LJ_UNLIKELY(!tvisnil(v)))
	  lj_err_caller(sbufL(sbx), LJ_ERR_BUFFER_DUPKEY);
	r = serialize_get(r, sbx, v);
      } while (--nhash);
    }
    sbx->depth++;
#if LJ_HASFFI
  } else if (tp >= SER_TAG_INT64 &&  tp <= SER_TAG_COMPLEX) {
    uint32_t sz = tp == SER_TAG_COMPLEX ? 16 : 8;
    GCcdata *cd;
    if (LJ_UNLIKELY(r + sz > w)) goto eob;
    cd = lj_cdata_new_(sbufL(sbx),
	   tp == SER_TAG_INT64 ? CTID_INT64 :
	   tp == SER_TAG_UINT64 ? CTID_UINT64 : CTID_COMPLEX_DOUBLE,
	   sz);
    memcpy(cdataptr(cd), r, sz); r += sz;
#if LJ_BE
    *(uint64_t *)cdataptr(cd) = lj_bswap64(*(uint64_t *)cdataptr(cd));
    if (sz == 16)
      ((uint64_t *)cdataptr(cd))[1] = lj_bswap64(((uint64_t *)cdataptr(cd))[1]);
#endif
    if (sz == 16) {  /* Fix non-canonical NaNs. */
      TValue *cdo = (TValue *)cdataptr(cd);
      if (!tvisnum(&cdo[0])) setnanV(&cdo[0]);
      if (!tvisnum(&cdo[1])) setnanV(&cdo[1]);
    }
    setcdataV(sbufL(sbx), o, cd);
#endif
  } else if (tp <= (LJ_64 ? SER_TAG_LIGHTUD64 : SER_TAG_LIGHTUD32)) {
    uintptr_t ud = 0;
    if (tp == SER_TAG_LIGHTUD32) {
      if (LJ_UNLIKELY(r + 4 > w)) goto eob;
      ud = (uintptr_t)(LJ_BE ? lj_bswap(lj_getu32(r)) : lj_getu32(r));
      r += 4;
    }
#if LJ_64
    else if (tp == SER_TAG_LIGHTUD64) {
      if (LJ_UNLIKELY(r + 8 > w)) goto eob;
      memcpy(&ud, r, 8); r += 8;
#if LJ_BE
      ud = lj_bswap64(ud);
#endif
    }
    setrawlightudV(o, lj_lightud_intern(sbufL(sbx), (void *)ud));
#else
    setrawlightudV(o, (void *)ud);
#endif
  } else {
badtag:
    lj_err_callerv(sbufL(sbx), LJ_ERR_BUFFER_BADDEC, tp);
  }
  return r;
eob:
  lj_err_caller(sbufL(sbx), LJ_ERR_BUFFER_EOB);
  return NULL;
}